

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3InsertBuiltinFuncs(FuncDef *aDef,int nDef)

{
  byte *z;
  ulong uVar1;
  int iVar2;
  FuncDef *pFVar3;
  FuncDef **ppFVar4;
  ulong uVar5;
  bool bVar6;
  long lStack_40;
  
  uVar5 = (ulong)(uint)nDef;
  if (nDef < 1) {
    uVar5 = 0;
  }
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    z = (byte *)aDef->zName;
    iVar2 = sqlite3Strlen30((char *)z);
    uVar1 = (ulong)(iVar2 + (uint)""[*z]) % 0x17;
    pFVar3 = functionSearch((int)uVar1,(char *)z);
    if (pFVar3 == (FuncDef *)0x0) {
      aDef->pNext = (FuncDef *)0x0;
      ppFVar4 = sqlite3BuiltinFunctions.a + uVar1;
      lStack_40 = 0x30;
    }
    else {
      ppFVar4 = &pFVar3->pNext;
      lStack_40 = 0x10;
    }
    *(FuncDef **)(&aDef->nArg + lStack_40) = *ppFVar4;
    *ppFVar4 = aDef;
    aDef = aDef + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3InsertBuiltinFuncs(
  FuncDef *aDef,      /* List of global functions to be inserted */
  int nDef            /* Length of the apDef[] list */
){
  int i;
  for(i=0; i<nDef; i++){
    FuncDef *pOther;
    const char *zName = aDef[i].zName;
    int nName = sqlite3Strlen30(zName);
    int h = (sqlite3UpperToLower[(u8)zName[0]] + nName) % SQLITE_FUNC_HASH_SZ;
    pOther = functionSearch(h, zName);
    if( pOther ){
      assert( pOther!=&aDef[i] && pOther->pNext!=&aDef[i] );
      aDef[i].pNext = pOther->pNext;
      pOther->pNext = &aDef[i];
    }else{
      aDef[i].pNext = 0;
      aDef[i].u.pHash = sqlite3BuiltinFunctions.a[h];
      sqlite3BuiltinFunctions.a[h] = &aDef[i];
    }
  }
}